

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udataswp.cpp
# Opt level: O3

int32_t udata_swapInvStringBlock_63
                  (UDataSwapper *ds,void *inData,int32_t length,void *outData,UErrorCode *pErrorCode
                  )

{
  bool bVar1;
  uint uVar2;
  int32_t iVar3;
  int iVar4;
  ulong uVar5;
  
  iVar3 = 0;
  if ((pErrorCode != (UErrorCode *)0x0) && (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    if ((length < 0 || (inData == (void *)0x0 || ds == (UDataSwapper *)0x0)) ||
       (length != 0 && outData == (void *)0x0)) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      uVar5 = 0;
      uVar2 = length;
      if (length != 0) {
        do {
          if (*(char *)((long)inData + ((ulong)uVar2 - 1)) == '\0') {
            uVar5 = (ulong)uVar2;
            break;
          }
          bVar1 = 1 < (int)uVar2;
          uVar2 = uVar2 - 1;
        } while (bVar1);
      }
      iVar4 = (int)uVar5;
      (*ds->swapInvChars)(ds,inData,iVar4,outData,pErrorCode);
      if ((length - iVar4 != 0 && iVar4 <= length) && inData != outData) {
        memcpy((void *)((long)outData + uVar5),(void *)((long)inData + uVar5),(long)(length - iVar4)
              );
      }
      iVar3 = length;
      if (U_ZERO_ERROR < *pErrorCode) {
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

U_CAPI int32_t U_EXPORT2
udata_swapInvStringBlock(const UDataSwapper *ds,
                         const void *inData, int32_t length, void *outData,
                         UErrorCode *pErrorCode) {
    const char *inChars;
    int32_t stringsLength;

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(ds==NULL || inData==NULL || length<0 || (length>0 && outData==NULL)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* reduce the strings length to not include bytes after the last NUL */
    inChars=(const char *)inData;
    stringsLength=length;
    while(stringsLength>0 && inChars[stringsLength-1]!=0) {
        --stringsLength;
    }

    /* swap up to the last NUL */
    ds->swapInvChars(ds, inData, stringsLength, outData, pErrorCode);

    /* copy the bytes after the last NUL */
    if(inData!=outData && length>stringsLength) {
        uprv_memcpy((char *)outData+stringsLength, inChars+stringsLength, length-stringsLength);
    }

    /* return the length including padding bytes */
    if(U_SUCCESS(*pErrorCode)) {
        return length;
    } else {
        return 0;
    }
}